

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForwardTypedefDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardTypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::ForwardTypeRestrictionSyntax*&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ForwardTypeRestrictionSyntax **args_2,Token *args_3,Token *args_4)

{
  Token typedefKeyword;
  Token semi;
  ForwardTypedefDeclarationSyntax *attributes;
  Token *in_RDX;
  Info *in_R8;
  undefined8 *in_R9;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  attributes = (ForwardTypedefDeclarationSyntax *)
               allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff88);
  typedefKeyword.info = (Info *)in_R8->rawTextPtr;
  typedefKeyword._0_8_ = (ForwardTypeRestrictionSyntax *)in_R9[1];
  semi.info = in_R8;
  semi._0_8_ = in_R9;
  slang::syntax::ForwardTypedefDeclarationSyntax::ForwardTypedefDeclarationSyntax
            ((ForwardTypedefDeclarationSyntax *)*in_R9,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes,typedefKeyword,
             (ForwardTypeRestrictionSyntax *)in_R9[1],*in_RDX,semi);
  return attributes;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }